

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassMethodPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,FunctionPrototypeSyntax *args_2,Token *args_3)

{
  Token semi;
  ClassMethodPrototypeSyntax *this_00;
  
  this_00 = (ClassMethodPrototypeSyntax *)allocate(this,0xa0,8);
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::ClassMethodPrototypeSyntax::ClassMethodPrototypeSyntax
            (this_00,args,args_1,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }